

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::lexer(lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        *this,input_adapter_t *adapter)

{
  char cVar1;
  int_type iVar2;
  long in_RDI;
  shared_ptr<nlohmann::detail::input_adapter_protocol> *in_stack_ffffffffffffffd8;
  shared_ptr<nlohmann::detail::input_adapter_protocol> *in_stack_ffffffffffffffe0;
  
  std::shared_ptr<nlohmann::detail::input_adapter_protocol>::shared_ptr
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  iVar2 = std::char_traits<char>::eof();
  *(int_type *)(in_RDI + 0x10) = iVar2;
  *(undefined1 *)(in_RDI + 0x14) = 0;
  *(undefined8 *)(in_RDI + 0x18) = 0;
  *(undefined8 *)(in_RDI + 0x20) = 0;
  *(undefined8 *)(in_RDI + 0x28) = 0;
  memset((void *)(in_RDI + 0x30),0,0x18);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x256e8a);
  std::__cxx11::string::string((string *)(in_RDI + 0x48));
  *(char **)(in_RDI + 0x68) = "";
  *(undefined8 *)(in_RDI + 0x70) = 0;
  *(undefined8 *)(in_RDI + 0x78) = 0;
  *(undefined8 *)(in_RDI + 0x80) = 0;
  cVar1 = get_decimal_point();
  *(char *)(in_RDI + 0x88) = cVar1;
  return;
}

Assistant:

explicit lexer(detail::input_adapter_t&& adapter)
        : ia(std::move(adapter)), decimal_point_char(get_decimal_point()) {}